

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O0

QAction * __thiscall
QtMWidgets::ToolBar::addAction(ToolBar *this,QIcon *icon,QObject *receiver,char *member)

{
  QObject *pQVar1;
  QAction *this_00;
  QObject local_60 [11];
  undefined1 local_55;
  QString local_48;
  QAction *local_30;
  QAction *action;
  char *member_local;
  QObject *receiver_local;
  QIcon *icon_local;
  ToolBar *this_local;
  
  action = (QAction *)member;
  member_local = (char *)receiver;
  receiver_local = (QObject *)icon;
  icon_local = (QIcon *)this;
  this_00 = (QAction *)operator_new(0x10);
  pQVar1 = receiver_local;
  local_55 = 1;
  QString::QString(&local_48);
  QAction::QAction(this_00,(QIcon *)pQVar1,(QString *)&local_48,(QObject *)this);
  local_55 = 0;
  QString::~QString(&local_48);
  local_30 = this_00;
  QObject::connect(local_60,(char *)this_00,(QObject *)"2triggered(bool)",member_local,
                   (ConnectionType)action);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  QWidget::addAction((QAction *)this);
  return local_30;
}

Assistant:

QAction *
ToolBar::addAction( const QIcon & icon,
	const QObject * receiver, const char * member )
{
	QAction * action = new QAction( icon, QString(), this );
	QObject::connect( action, SIGNAL( triggered(bool) ), receiver, member );
	addAction( action );
	return action;
}